

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocsp.cc
# Opt level: O0

bool bssl::anon_unknown_18::VerifyOCSPResponseSignature
               (OCSPResponse *response,OCSPResponseData *response_data,
               ParsedCertificate *issuer_certificate)

{
  bool bVar1;
  element_type *peVar2;
  size_t extraout_RDX;
  Span<const_unsigned_char> b;
  int local_7c;
  bssl *local_78;
  uchar *local_70;
  string_view local_68;
  undefined1 local_58 [8];
  shared_ptr<const_bssl::ParsedCertificate> cur_responder_certificate;
  Input *responder_cert_tlv;
  const_iterator __end2;
  const_iterator __begin2;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *__range2;
  ParsedCertificate *issuer_certificate_local;
  OCSPResponseData *response_data_local;
  OCSPResponse *response_local;
  
  bVar1 = CheckResponderIDMatchesCertificate(&response_data->responder_id,issuer_certificate);
  if ((bVar1) && (bVar1 = VerifyOCSPResponseSignatureGivenCert(response,issuer_certificate), bVar1))
  {
    response_local._7_1_ = 1;
  }
  else {
    __end2 = ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::begin
                       (&response->certs);
    responder_cert_tlv =
         (Input *)::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::end
                            (&response->certs);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
                                       *)&responder_cert_tlv), bVar1) {
      cur_responder_certificate.
      super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              __gnu_cxx::
              __normal_iterator<const_bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
              ::operator*(&__end2);
      Span<unsigned_char_const>::Span<bssl::der::Input,void,bssl::der::Input>
                ((Span<unsigned_char_const> *)&local_78,
                 (Input *)cur_responder_certificate.
                          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi);
      b.size_ = extraout_RDX;
      b.data_ = local_70;
      local_68 = BytesAsStringView(local_78,b);
      OCSPParseCertificate((anon_unknown_18 *)local_58,local_68);
      bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_58);
      if (bVar1) {
        peVar2 = ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                             *)local_58);
        bVar1 = CheckResponderIDMatchesCertificate(&response_data->responder_id,peVar2);
        if (bVar1) {
          peVar2 = ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::
                   get((__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> *)
                       local_58);
          bVar1 = VerifyAuthorizedResponderCert(peVar2,issuer_certificate);
          if (bVar1) {
            peVar2 = ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                     ::get((__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                            *)local_58);
            bVar1 = VerifyOCSPResponseSignatureGivenCert(response,peVar2);
            if (bVar1) {
              response_local._7_1_ = 1;
              local_7c = 1;
            }
            else {
              local_7c = 0;
            }
          }
          else {
            local_7c = 3;
          }
        }
        else {
          local_7c = 3;
        }
      }
      else {
        local_7c = 3;
      }
      ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr
                ((shared_ptr<const_bssl::ParsedCertificate> *)local_58);
      if ((local_7c != 0) && (local_7c == 1)) goto LAB_005e7e2b;
      __gnu_cxx::
      __normal_iterator<const_bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
      ::operator++(&__end2);
    }
    response_local._7_1_ = 0;
  }
LAB_005e7e2b:
  return (bool)(response_local._7_1_ & 1);
}

Assistant:

[[nodiscard]] bool VerifyOCSPResponseSignature(
    const OCSPResponse &response, const OCSPResponseData &response_data,
    const ParsedCertificate *issuer_certificate) {
  // In order to verify the OCSP signature, a valid responder matching the OCSP
  // Responder ID must be located (RFC 6960, 4.2.2.2). The responder is allowed
  // to be either the certificate issuer or a delegated authority directly
  // signed by the issuer.
  if (CheckResponderIDMatchesCertificate(response_data.responder_id,
                                         issuer_certificate) &&
      VerifyOCSPResponseSignatureGivenCert(response, issuer_certificate)) {
    return true;
  }

  // Otherwise search through the provided certificates for the Authorized
  // Responder. Want a certificate that:
  //  (1) Matches the OCSP Responder ID.
  //  (2) Has been given authority for OCSP signing by |issuer_certificate|.
  //  (3) Has signed the OCSP response using its public key.
  for (const auto &responder_cert_tlv : response.certs) {
    std::shared_ptr<const ParsedCertificate> cur_responder_certificate =
        OCSPParseCertificate(BytesAsStringView(responder_cert_tlv));

    // If failed parsing the certificate, keep looking.
    if (!cur_responder_certificate) {
      continue;
    }

    // If the certificate doesn't match the OCSP's responder ID, keep looking.
    if (!CheckResponderIDMatchesCertificate(response_data.responder_id,
                                            cur_responder_certificate.get())) {
      continue;
    }

    // If the certificate isn't a valid Authorized Responder certificate, keep
    // looking.
    if (!VerifyAuthorizedResponderCert(cur_responder_certificate.get(),
                                       issuer_certificate)) {
      continue;
    }

    // If the certificate signed this OCSP response, have found a match.
    // Otherwise keep looking.
    if (VerifyOCSPResponseSignatureGivenCert(response,
                                             cur_responder_certificate.get())) {
      return true;
    }
  }

  // Failed to confirm the validity of the OCSP signature using any of the
  // candidate certificates.
  return false;
}